

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.hpp
# Opt level: O3

int __thiscall optimization::inlineFunc::Inline_Func::init(Inline_Func *this,EVP_PKEY_CTX *ctx)

{
  _Base_ptr p_Var1;
  _Base_ptr __n;
  int iVar2;
  _Rb_tree_node_base *in_RAX;
  long *plVar3;
  _Rb_tree_node_base *p_Var4;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  _Base_ptr p_Var5;
  _Self __tmp;
  
  if (*(_Rb_tree_node_base **)(ctx + 0x20) != (_Rb_tree_node_base *)(ctx + 0x10)) {
    in_RAX = *(_Rb_tree_node_base **)(ctx + 0x20);
    do {
      p_Var4 = *(_Rb_tree_node_base **)(in_RAX + 6);
      if (p_Var4 != (_Rb_tree_node_base *)&in_RAX[5]._M_left) {
        do {
          if (*(int *)&p_Var4[5]._M_left == 2) {
LAB_0012314d:
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&this->uninlineable_funcs,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (in_RAX + 1));
            break;
          }
          p_Var1 = p_Var4[3]._M_left;
          for (p_Var5 = p_Var4[3]._M_parent; p_Var5 != p_Var1;
              p_Var5 = (_Base_ptr)&p_Var5->_M_parent) {
            iVar2 = (**(code **)(**(long **)p_Var5 + 8))();
            if (iVar2 == 6) {
              plVar3 = *(long **)p_Var5;
              if ((undefined **)*plVar3 != &PTR_display_001ed108) {
                plVar3 = (long *)0x0;
              }
              __n = (_Base_ptr)plVar3[4];
              if ((__n == in_RAX[1]._M_parent) &&
                 ((__n == (_Base_ptr)0x0 ||
                  (iVar2 = bcmp((void *)plVar3[3],*(void **)(in_RAX + 1),(size_t)__n), iVar2 == 0)))
                 ) goto LAB_0012314d;
            }
          }
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
        } while (p_Var4 != (_Rb_tree_node_base *)&in_RAX[5]._M_left);
      }
      in_RAX = (_Rb_tree_node_base *)std::_Rb_tree_increment(in_RAX);
    } while (in_RAX != (_Rb_tree_node_base *)(ctx + 0x10));
  }
  return (int)in_RAX;
}

Assistant:

void init(mir::inst::MirPackage& package) {
    for (auto iter = package.functions.begin(); iter != package.functions.end();
         iter++) {
      bool flag = false;
      for (auto& blkpair : iter->second.basic_blks) {
        if (blkpair.second.jump.jump_kind == mir::inst::JumpKind::Loop) {
          flag = true;
          uninlineable_funcs.insert(iter->first);
          break;
        }
        auto& insts = blkpair.second.inst;
        for (auto& inst : insts) {
          if (inst->inst_kind() != mir::inst::InstKind::Call) {
            continue;
          }
          auto& iptr = *inst;
          auto callInst = dynamic_cast<mir::inst::CallInst*>(&iptr);
          if (callInst->func == iter->first) {
            uninlineable_funcs.insert(iter->first);
            flag = true;
            break;
          }
        }
        if (flag) {
          break;
        }
      }
    }
  }